

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_6d004::SwiftCompilerShellCommand::executeExternalCommand
          (SwiftCompilerShellCommand *this,BuildSystem *system,TaskInterface ti,
          QueueJobContext *context,
          Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn)

{
  _Any_data *p_Var1;
  pointer pbVar2;
  pointer pbVar3;
  pointer pbVar4;
  _func_int *p_Var5;
  pointer pcVar6;
  code *pcVar7;
  string *psVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  BuildEngineDelegate *pBVar11;
  long *plVar12;
  Child *pCVar13;
  raw_ostream *prVar14;
  pointer pbVar15;
  Child *pCVar16;
  ulong uVar17;
  Style style;
  void *pvVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  size_t sVar20;
  Child CVar21;
  void *pvVar22;
  SmallString<16U> *extraout_RDX;
  SmallString<16U> *extraout_RDX_00;
  SmallString<16U> *extraout_RDX_01;
  SmallString<16U> *extraout_RDX_02;
  SmallString<16U> *extraout_RDX_03;
  SmallString<16U> *pSVar23;
  SmallString<16U> *extraout_RDX_04;
  SmallString<16U> *extraout_RDX_05;
  SmallString<16U> *extraout_RDX_06;
  SmallString<16U> *extraout_RDX_07;
  SmallString<16U> *extraout_RDX_08;
  SmallString<16U> *extraout_RDX_09;
  SmallString<16U> *extraout_RDX_10;
  SmallString<16U> *extraout_RDX_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_15;
  SmallString<16U> *extraout_RDX_16;
  SmallString<16U> *extraout_RDX_17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_21;
  SmallString<16U> *extraout_RDX_22;
  SmallString<16U> *extraout_RDX_23;
  SmallString<16U> *extraout_RDX_24;
  SmallString<16U> *extraout_RDX_25;
  SmallString<16U> *extraout_RDX_26;
  SmallString<16U> *extraout_RDX_27;
  int iVar25;
  int __fd;
  long *plVar26;
  ulong uVar27;
  char *pcVar28;
  Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *pOVar29;
  StringRef outputFileMapPath_00;
  StringRef Filename;
  StringRef path;
  StringRef path_00;
  StringRef Str;
  ArrayRef<llvm::StringRef> commandLine_00;
  raw_fd_ostream os;
  SmallString<16U> depsPath_1;
  SmallString<16U> object;
  SmallString<16U> depsPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  SmallString<16U> swiftDepsPath;
  SmallString<16U> masterDepsPath;
  StringRef sourceStem;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depsFiles;
  StringRef objectDir;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> commandLine;
  SmallString<16U> data;
  SmallString<64U> outputFileMapPath;
  error_code ec;
  Child local_2f0;
  undefined4 local_2e8;
  undefined4 uStack_2e4;
  void *pvStack_2e0;
  char *pcStack_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  char local_2b8;
  undefined4 local_2b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  Child local_290;
  void *local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  Child local_270;
  char *local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  Child local_250;
  char *local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  string *local_230;
  Child local_228;
  void *local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  Child local_208;
  void *local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *local_1e8;
  int local_1dc;
  Child local_1d8;
  undefined8 local_1d0;
  undefined1 local_1c8 [16];
  TaskInterface local_1b8;
  long local_1a8;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  TaskInterface local_198;
  StringRef local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  QueueJobContext *local_158;
  SwiftCompilerShellCommand *local_150;
  StringRef local_148;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> local_138;
  undefined1 local_120 [24];
  _Manager_type local_108;
  _Invoker_type p_Stack_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined1 local_e8 [64];
  _Any_data local_a8;
  _Manager_type local_98;
  _Invoker_type p_Stack_90;
  Twine local_88;
  Twine local_70;
  error_code local_58;
  Twine local_48;
  
  pvVar18 = ti.ctx;
  pvVar22 = ti.impl;
  pbVar15 = (this->sourcesList).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->sourcesList).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_198.impl = pvVar22;
  local_198.ctx = pvVar18;
  if (pbVar15 == pbVar2) {
    plVar12 = *(long **)((long)system->impl + 8);
    pcVar28 = "no configured \'sources\'";
  }
  else {
    pbVar3 = (this->objectsList).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar4 = (this->objectsList).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar3 == pbVar4) {
      plVar12 = *(long **)((long)system->impl + 8);
      pcVar28 = "no configured \'objects\'";
    }
    else if ((this->moduleName)._M_string_length == 0) {
      plVar12 = *(long **)((long)system->impl + 8);
      pcVar28 = "no configured \'module-name\'";
    }
    else if ((this->tempsPath)._M_string_length == 0) {
      plVar12 = *(long **)((long)system->impl + 8);
      pcVar28 = "no configured \'temps-path\'";
    }
    else {
      if ((long)pbVar2 - (long)pbVar15 == (long)pbVar4 - (long)pbVar3) {
        local_230 = &this->tempsPath;
        local_1e8 = completionFn;
        local_158 = context;
        (**(code **)(**(long **)((long)system->impl + 0x10) + 0x18))();
        local_f8._M_allocated_capacity = (size_type)local_e8;
        local_f8._8_4_ = 0;
        local_f8._12_4_ = 0x40;
        getOutputFileMapPath(this,(SmallVectorImpl<char> *)&local_f8);
        local_138.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_138.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
        super__Vector_impl_data._M_start = (StringRef *)0x0;
        local_138.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        outputFileMapPath_00.Length._0_4_ = local_f8._8_4_;
        outputFileMapPath_00.Data = (char *)local_f8._M_allocated_capacity;
        outputFileMapPath_00.Length._4_4_ = 0;
        constructCommandLineArgs(this,outputFileMapPath_00,&local_138);
        uVar9 = local_f8._M_allocated_capacity;
        local_178.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_178.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_178.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        if ((long)(this->sourcesList).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->sourcesList).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
            (long)(this->objectsList).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->objectsList).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
          __assert_fail("sourcesList.size() == objectsList.size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp"
                        ,0xad6,
                        "bool (anonymous namespace)::SwiftCompilerShellCommand::writeOutputFileMap(TaskInterface, StringRef, std::vector<std::string> &) const"
                       );
        }
        Filename.Length._0_4_ = local_f8._8_4_;
        Filename.Data = (char *)local_f8._M_allocated_capacity;
        uVar27 = (ulong)(uint)local_f8._8_4_;
        local_120._0_8_ = local_120 + 0x10;
        local_120._8_8_ = (void *)0x1000000000;
        local_58._M_value = 0;
        local_58._M_cat = (error_category *)std::_V2::system_category();
        Filename.Length._4_4_ = 0;
        llvm::raw_fd_ostream::raw_fd_ostream((raw_fd_ostream *)&local_2f0,Filename,&local_58,F_Text)
        ;
        local_1dc = local_58._M_value;
        if (local_58._M_value == 0) {
          if ((ulong)((long)pvStack_2e0 - (long)pcStack_2d8) < 2) {
            llvm::raw_ostream::write
                      ((raw_ostream *)&local_2f0,0x1a0163,(void *)0x2,
                       (long)pvStack_2e0 - (long)pcStack_2d8);
          }
          else {
            pcStack_2d8[0] = '{';
            pcStack_2d8[1] = '\n';
            pcStack_2d8 = pcStack_2d8 + 2;
          }
          local_1b8.impl = &local_1a8;
          local_1b8.ctx = (void *)0x1000000000;
          llvm::Twine::Twine((Twine *)&local_250,local_230);
          llvm::Twine::Twine((Twine *)&local_270,"master.swiftdeps");
          llvm::Twine::Twine((Twine *)&local_228,"");
          llvm::Twine::Twine((Twine *)&local_1d8,"");
          llvm::sys::path::append
                    ((SmallVectorImpl<char> *)&local_1b8,(Twine *)&local_250,(Twine *)&local_270,
                     (Twine *)&local_228,(Twine *)&local_1d8);
          if ((ulong)((long)pvStack_2e0 - (long)pcStack_2d8) < 8) {
            llvm::raw_ostream::write
                      ((raw_ostream *)&local_2f0,0x1a015d,(void *)0x8,
                       (long)pvStack_2e0 - (long)pcStack_2d8);
            pSVar23 = extraout_RDX_00;
          }
          else {
            builtin_strncpy(pcStack_2d8,"  \"\": {\n",8);
            pcStack_2d8 = pcStack_2d8 + 8;
            pSVar23 = extraout_RDX;
          }
          if (this->enableWholeModuleOptimization == true) {
            local_250.twine = (Twine *)&local_240;
            local_248 = (char *)0x1000000000;
            llvm::Twine::Twine((Twine *)&local_228,local_230);
            local_270.twine = (Twine *)&local_260;
            pcVar6 = (this->moduleName)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_270,pcVar6,pcVar6 + (this->moduleName)._M_string_length);
            std::__cxx11::string::append(&local_270.character);
            llvm::Twine::Twine((Twine *)&local_1d8,(string *)&local_270);
            llvm::Twine::Twine((Twine *)&local_290,"");
            llvm::Twine::Twine((Twine *)&local_208,"");
            llvm::sys::path::append
                      ((SmallVectorImpl<char> *)&local_250,(Twine *)&local_228,(Twine *)&local_1d8,
                       (Twine *)&local_290,(Twine *)&local_208);
            if (local_270.twine != (Twine *)&local_260) {
              operator_delete(local_270.twine,
                              CONCAT71(local_260._M_allocated_capacity._1_7_,
                                       local_260._M_local_buf[0]) + 1);
            }
            local_270.twine = (Twine *)&local_260;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250.twine ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              local_268 = (char *)0x0;
              local_260._M_local_buf[0] = '\0';
            }
            else {
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_270,local_250.twine,
                         (long)&(local_250.twine)->LHS + ((ulong)local_248 & 0xffffffff));
            }
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_178,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_270);
            if (local_270.twine != (Twine *)&local_260) {
              operator_delete(local_270.twine,
                              CONCAT71(local_260._M_allocated_capacity._1_7_,
                                       local_260._M_local_buf[0]) + 1);
            }
            local_268 = (char *)0x1000000000;
            local_270.twine = (Twine *)&local_260;
            llvm::Twine::Twine((Twine *)&local_1d8,local_230);
            local_228.twine = (Twine *)&local_218;
            pcVar6 = (this->moduleName)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_228,pcVar6,pcVar6 + (this->moduleName)._M_string_length);
            std::__cxx11::string::append(&local_228.character);
            llvm::Twine::Twine((Twine *)&local_290,(string *)&local_228);
            llvm::Twine::Twine((Twine *)&local_208,"");
            llvm::Twine::Twine(&local_88,"");
            llvm::sys::path::append
                      ((SmallVectorImpl<char> *)&local_270,(Twine *)&local_1d8,(Twine *)&local_290,
                       (Twine *)&local_208,&local_88);
            pSVar23 = extraout_RDX_01;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228.twine != &local_218) {
              operator_delete(local_228.twine,local_218._M_allocated_capacity + 1);
              pSVar23 = extraout_RDX_02;
            }
            sVar20 = (long)pvStack_2e0 - (long)pcStack_2d8;
            if (sVar20 < 0x15) {
              pCVar13 = (Child *)llvm::raw_ostream::write
                                           ((raw_ostream *)&local_2f0,0x1a016c,(void *)0x15,sVar20);
              pSVar23 = extraout_RDX_03;
            }
            else {
              builtin_strncpy(pcStack_2d8,"    \"dependencies\": \"",0x15);
              sVar20 = 0x22203a2273656963;
              pCVar13 = &local_2f0;
              pcStack_2d8 = pcStack_2d8 + 0x15;
            }
            llbuild::basic::escapeForJSON<llvm::SmallString<16u>>
                      ((string *)&local_228,(basic *)&local_250.character,pSVar23);
            prVar14 = (raw_ostream *)
                      llvm::raw_ostream::write
                                ((raw_ostream *)pCVar13,local_228.decI,local_220,sVar20);
            pcVar28 = prVar14->OutBufCur;
            pSVar23 = (SmallString<16U> *)(prVar14->OutBufEnd + -(long)pcVar28);
            if (pSVar23 < (SmallString<16U> *)0x3) {
              llvm::raw_ostream::write(prVar14,0x1a0182,(void *)0x3,(size_t)pcVar28);
              pSVar23 = extraout_RDX_04;
            }
            else {
              pcVar28[2] = '\n';
              pcVar28[0] = '\"';
              pcVar28[1] = ',';
              prVar14->OutBufCur = prVar14->OutBufCur + 3;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228.twine != &local_218) {
              operator_delete(local_228.twine,local_218._M_allocated_capacity + 1);
              pSVar23 = extraout_RDX_05;
            }
            sVar20 = (long)pvStack_2e0 - (long)pcStack_2d8;
            if (sVar20 < 0xf) {
              pCVar13 = (Child *)llvm::raw_ostream::write
                                           ((raw_ostream *)&local_2f0,0x1a0186,(void *)0xf,sVar20);
              pSVar23 = extraout_RDX_06;
            }
            else {
              builtin_strncpy(pcStack_2d8,"    \"object\": \"",0xf);
              sVar20 = 0x6a626f2220202020;
              pCVar13 = &local_2f0;
              pcStack_2d8 = pcStack_2d8 + 0xf;
            }
            llbuild::basic::escapeForJSON<llvm::SmallString<16u>>
                      ((string *)&local_228,(basic *)&local_270.character,pSVar23);
            prVar14 = (raw_ostream *)
                      llvm::raw_ostream::write
                                ((raw_ostream *)pCVar13,local_228.decI,local_220,sVar20);
            pcVar28 = prVar14->OutBufCur;
            pSVar23 = (SmallString<16U> *)(prVar14->OutBufEnd + -(long)pcVar28);
            if (pSVar23 < (SmallString<16U> *)0x3) {
              llvm::raw_ostream::write(prVar14,0x1a0182,(void *)0x3,(size_t)pcVar28);
              pSVar23 = extraout_RDX_07;
            }
            else {
              pcVar28[2] = '\n';
              pcVar28[0] = '\"';
              pcVar28[1] = ',';
              prVar14->OutBufCur = prVar14->OutBufCur + 3;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228.twine != &local_218) {
              operator_delete(local_228.twine,local_218._M_allocated_capacity + 1);
              pSVar23 = extraout_RDX_08;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_270.twine != &local_260) {
              free(local_270.twine);
              pSVar23 = extraout_RDX_09;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250.twine != &local_240) {
              free(local_250.twine);
              pSVar23 = extraout_RDX_10;
            }
          }
          pCVar13 = &local_2f0;
          sVar20 = (long)pvStack_2e0 - (long)pcStack_2d8;
          if (sVar20 < 0x1b) {
            pCVar13 = (Child *)llvm::raw_ostream::write
                                         ((raw_ostream *)&local_2f0,0x1a0196,(void *)0x1b,sVar20);
            pSVar23 = extraout_RDX_11;
          }
          else {
            builtin_strncpy(pcStack_2d8,"    \"swift-dependencies\": \"",0x1b);
            pcStack_2d8 = pcStack_2d8 + 0x1b;
          }
          llbuild::basic::escapeForJSON<llvm::SmallString<16u>>
                    ((string *)&local_250,(basic *)&local_1b8,pSVar23);
          __fd = local_250.decI;
          prVar14 = (raw_ostream *)
                    llvm::raw_ostream::write((raw_ostream *)pCVar13,__fd,local_248,sVar20);
          pcVar28 = prVar14->OutBufCur;
          if ((ulong)((long)prVar14->OutBufEnd - (long)pcVar28) < 2) {
            __fd = 0x1a4f95;
            llvm::raw_ostream::write(prVar14,0x1a4f95,(void *)0x2,(size_t)pcVar28);
          }
          else {
            pcVar28[0] = '\"';
            pcVar28[1] = '\n';
            prVar14->OutBufCur = prVar14->OutBufCur + 2;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250.twine != &local_240) {
            uVar27 = local_240._M_allocated_capacity + 1;
            operator_delete(local_250.twine,uVar27);
            __fd = (int)uVar27;
          }
          if ((ulong)((long)pvStack_2e0 - (long)pcStack_2d8) < 5) {
            __fd = 0x1a01b2;
            llvm::raw_ostream::write
                      ((raw_ostream *)&local_2f0,0x1a01b2,(void *)0x5,
                       (long)pvStack_2e0 - (long)pcStack_2d8);
          }
          else {
            builtin_strncpy(pcStack_2d8,"  },\n",5);
            pcStack_2d8 = pcStack_2d8 + 5;
          }
          pbVar15 = (this->sourcesList).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((this->sourcesList).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish != pbVar15) {
            iVar25 = 1;
            uVar27 = 0;
            local_150 = this;
            do {
              local_230 = (string *)CONCAT44(local_230._4_4_,iVar25);
              local_250.twine = (Twine *)&local_240;
              pcVar6 = pbVar15[uVar27]._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_250,pcVar6,pcVar6 + pbVar15[uVar27]._M_string_length);
              pbVar15 = (this->objectsList).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              CVar21.twine = (Twine *)&local_260;
              pcVar6 = pbVar15[uVar27]._M_dataplus._M_p;
              local_270.twine = CVar21.twine;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_270,pcVar6,pcVar6 + pbVar15[uVar27]._M_string_length);
              path.Length = 2;
              path.Data = local_268;
              style = CVar21.decUI;
              local_148 = llvm::sys::path::parent_path((path *)local_270.twine,path,style);
              path_00.Length = 2;
              path_00.Data = local_248;
              local_188 = llvm::sys::path::stem((path *)local_250.twine,path_00,style);
              local_228.twine = (Twine *)&local_218;
              local_220 = (void *)0x1000000000;
              llvm::Twine::Twine((Twine *)&local_1d8,&local_148);
              llvm::Twine::Twine((Twine *)&local_290,&local_188,"~partial.swiftmodule");
              llvm::Twine::Twine((Twine *)&local_208,"");
              llvm::Twine::Twine(&local_88,"");
              llvm::sys::path::append
                        ((SmallVectorImpl<char> *)&local_228,(Twine *)&local_1d8,(Twine *)&local_290
                         ,(Twine *)&local_208,&local_88);
              local_1d8.twine = (Twine *)local_1c8;
              local_1d0 = 0x1000000000;
              llvm::Twine::Twine((Twine *)&local_290,&local_148);
              llvm::Twine::Twine((Twine *)&local_208,&local_188,".swiftdeps");
              llvm::Twine::Twine(&local_88,"");
              llvm::Twine::Twine(&local_70,"");
              llvm::sys::path::append
                        ((SmallVectorImpl<char> *)&local_1d8,(Twine *)&local_290,(Twine *)&local_208
                         ,&local_88,&local_70);
              sVar20 = (long)pvStack_2e0 - (long)pcStack_2d8;
              if (sVar20 < 3) {
                pCVar13 = (Child *)llvm::raw_ostream::write
                                             ((raw_ostream *)&local_2f0,0x1a01cd,(void *)0x3,sVar20)
                ;
                pbVar24 = extraout_RDX_13;
              }
              else {
                pcStack_2d8[2] = '\"';
                pcStack_2d8[0] = ' ';
                pcStack_2d8[1] = ' ';
                pcStack_2d8 = pcStack_2d8 + 3;
                pCVar13 = &local_2f0;
                pbVar24 = extraout_RDX_12;
              }
              llbuild::basic::escapeForJSON<std::__cxx11::string>
                        ((string *)&local_290,(basic *)&local_250.character,pbVar24);
              prVar14 = (raw_ostream *)
                        llvm::raw_ostream::write
                                  ((raw_ostream *)pCVar13,local_290.decI,local_288,sVar20);
              this = local_150;
              pcVar28 = prVar14->OutBufCur;
              pbVar24 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (prVar14->OutBufEnd + -(long)pcVar28);
              if (pbVar24 < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5
                 ) {
                llvm::raw_ostream::write(prVar14,0x1a0160,(void *)0x5,(size_t)pcVar28);
                pbVar24 = extraout_RDX_14;
              }
              else {
                builtin_strncpy(pcVar28,"\": {\n",5);
                prVar14->OutBufCur = prVar14->OutBufCur + 5;
              }
              if (local_290.twine != (Twine *)&local_280) {
                operator_delete(local_290.twine,local_280._M_allocated_capacity + 1);
                pbVar24 = extraout_RDX_15;
              }
              if (this->enableWholeModuleOptimization == false) {
                local_288 = (void *)0x1000000000;
                local_290.twine = (Twine *)&local_280;
                llvm::Twine::Twine((Twine *)&local_208,&local_148);
                llvm::Twine::Twine(&local_88,&local_188,".d");
                llvm::Twine::Twine(&local_70,"");
                llvm::Twine::Twine(&local_48,"");
                llvm::sys::path::append
                          ((SmallVectorImpl<char> *)&local_290,(Twine *)&local_208,&local_88,
                           &local_70,&local_48);
                sVar20 = (long)pvStack_2e0 - (long)pcStack_2d8;
                if (sVar20 < 0x15) {
                  pCVar13 = (Child *)llvm::raw_ostream::write
                                               ((raw_ostream *)&local_2f0,0x1a016c,(void *)0x15,
                                                sVar20);
                  pSVar23 = extraout_RDX_17;
                }
                else {
                  builtin_strncpy(pcStack_2d8,"    \"dependencies\": \"",0x15);
                  sVar20 = 0x22203a2273656963;
                  pcStack_2d8 = pcStack_2d8 + 0x15;
                  pCVar13 = &local_2f0;
                  pSVar23 = extraout_RDX_16;
                }
                llbuild::basic::escapeForJSON<llvm::SmallString<16u>>
                          ((string *)&local_208,(basic *)&local_290.character,pSVar23);
                prVar14 = (raw_ostream *)
                          llvm::raw_ostream::write
                                    ((raw_ostream *)pCVar13,local_208.decI,local_200,sVar20);
                pcVar28 = prVar14->OutBufCur;
                if ((ulong)((long)prVar14->OutBufEnd - (long)pcVar28) < 3) {
                  llvm::raw_ostream::write(prVar14,0x1a0182,(void *)0x3,(size_t)pcVar28);
                }
                else {
                  pcVar28[2] = '\n';
                  pcVar28[0] = '\"';
                  pcVar28[1] = ',';
                  prVar14->OutBufCur = prVar14->OutBufCur + 3;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_208.twine != &local_1f8) {
                  operator_delete(local_208.twine,
                                  CONCAT71(local_1f8._M_allocated_capacity._1_7_,
                                           local_1f8._M_local_buf[0]) + 1);
                }
                local_208.twine = (Twine *)&local_1f8;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_290.twine ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  local_200 = (void *)0x0;
                  local_1f8._M_local_buf[0] = '\0';
                }
                else {
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_208,local_290.twine,
                             (long)&(local_290.twine)->LHS + ((ulong)local_288 & 0xffffffff));
                }
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_178,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_208);
                pbVar24 = extraout_RDX_18;
                if (local_208.twine != (Twine *)&local_1f8) {
                  operator_delete(local_208.twine,
                                  CONCAT71(local_1f8._M_allocated_capacity._1_7_,
                                           local_1f8._M_local_buf[0]) + 1);
                  pbVar24 = extraout_RDX_19;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_290.twine != &local_280) {
                  free(local_290.twine);
                  pbVar24 = extraout_RDX_20;
                }
              }
              pCVar13 = &local_2f0;
              sVar20 = (long)pvStack_2e0 - (long)pcStack_2d8;
              if (sVar20 < 0xf) {
                pCVar16 = (Child *)llvm::raw_ostream::write
                                             ((raw_ostream *)pCVar13,0x1a0186,(void *)0xf,sVar20);
                pbVar24 = extraout_RDX_21;
              }
              else {
                builtin_strncpy(pcStack_2d8,"    \"object\": \"",0xf);
                sVar20 = 0x6a626f2220202020;
                pcStack_2d8 = pcStack_2d8 + 0xf;
                pCVar16 = pCVar13;
              }
              llbuild::basic::escapeForJSON<std::__cxx11::string>
                        ((string *)&local_290,(basic *)&local_270.character,pbVar24);
              prVar14 = (raw_ostream *)
                        llvm::raw_ostream::write
                                  ((raw_ostream *)pCVar16,local_290.decI,local_288,sVar20);
              pcVar28 = prVar14->OutBufCur;
              pSVar23 = (SmallString<16U> *)(prVar14->OutBufEnd + -(long)pcVar28);
              if (pSVar23 < (SmallString<16U> *)0x3) {
                llvm::raw_ostream::write(prVar14,0x1a0182,(void *)0x3,(size_t)pcVar28);
                pSVar23 = extraout_RDX_22;
              }
              else {
                pcVar28[2] = '\n';
                pcVar28[0] = '\"';
                pcVar28[1] = ',';
                prVar14->OutBufCur = prVar14->OutBufCur + 3;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_290.twine != &local_280) {
                operator_delete(local_290.twine,local_280._M_allocated_capacity + 1);
                pSVar23 = extraout_RDX_23;
              }
              sVar20 = (long)pvStack_2e0 - (long)pcStack_2d8;
              if (sVar20 < 0x14) {
                pCVar16 = (Child *)llvm::raw_ostream::write
                                             ((raw_ostream *)pCVar13,0x1a01d1,(void *)0x14,sVar20);
                pSVar23 = extraout_RDX_24;
              }
              else {
                builtin_strncpy(pcStack_2d8,"    \"swiftmodule\": \"",0x14);
                pcStack_2d8 = pcStack_2d8 + 0x14;
                pCVar16 = pCVar13;
              }
              llbuild::basic::escapeForJSON<llvm::SmallString<16u>>
                        ((string *)&local_290,(basic *)&local_228.character,pSVar23);
              prVar14 = (raw_ostream *)
                        llvm::raw_ostream::write
                                  ((raw_ostream *)pCVar16,local_290.decI,local_288,sVar20);
              pcVar28 = prVar14->OutBufCur;
              pSVar23 = (SmallString<16U> *)(prVar14->OutBufEnd + -(long)pcVar28);
              if (pSVar23 < (SmallString<16U> *)0x3) {
                llvm::raw_ostream::write(prVar14,0x1a0182,(void *)0x3,(size_t)pcVar28);
                pSVar23 = extraout_RDX_25;
              }
              else {
                pcVar28[2] = '\n';
                pcVar28[0] = '\"';
                pcVar28[1] = ',';
                prVar14->OutBufCur = prVar14->OutBufCur + 3;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_290.twine != &local_280) {
                operator_delete(local_290.twine,local_280._M_allocated_capacity + 1);
                pSVar23 = extraout_RDX_26;
              }
              sVar20 = (long)pvStack_2e0 - (long)pcStack_2d8;
              if (sVar20 < 0x1b) {
                pCVar16 = (Child *)llvm::raw_ostream::write
                                             ((raw_ostream *)pCVar13,0x1a0196,(void *)0x1b,sVar20);
                pSVar23 = extraout_RDX_27;
              }
              else {
                builtin_strncpy(pcStack_2d8,"    \"swift-dependencies\": \"",0x1b);
                pcStack_2d8 = pcStack_2d8 + 0x1b;
                pCVar16 = pCVar13;
              }
              llbuild::basic::escapeForJSON<llvm::SmallString<16u>>
                        ((string *)&local_290,(basic *)&local_1d8.character,pSVar23);
              prVar14 = (raw_ostream *)
                        llvm::raw_ostream::write
                                  ((raw_ostream *)pCVar16,local_290.decI,local_288,sVar20);
              pcVar28 = prVar14->OutBufCur;
              if ((ulong)((long)prVar14->OutBufEnd - (long)pcVar28) < 2) {
                llvm::raw_ostream::write(prVar14,0x1a4f95,(void *)0x2,(size_t)pcVar28);
              }
              else {
                pcVar28[0] = '\"';
                pcVar28[1] = '\n';
                prVar14->OutBufCur = prVar14->OutBufCur + 2;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_290.twine != &local_280) {
                operator_delete(local_290.twine,local_280._M_allocated_capacity + 1);
              }
              psVar8 = local_230;
              iVar25 = (int)local_230;
              if ((ulong)((long)pvStack_2e0 - (long)pcStack_2d8) < 3) {
                pCVar13 = (Child *)llvm::raw_ostream::write
                                             ((raw_ostream *)pCVar13,0x1a01e6,(void *)0x3,
                                              (long)pvStack_2e0 - (long)pcStack_2d8);
              }
              else {
                pcStack_2d8[2] = '}';
                pcStack_2d8[0] = ' ';
                pcStack_2d8[1] = ' ';
                pcStack_2d8 = pcStack_2d8 + 3;
              }
              uVar27 = (ulong)psVar8 & 0xffffffff;
              uVar17 = (long)(this->sourcesList).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->sourcesList).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5;
              pcVar28 = "";
              if (uVar27 < uVar17) {
                pcVar28 = ",";
              }
              Str.Length._0_1_ = uVar27 < uVar17;
              Str.Data = pcVar28;
              Str.Length._1_7_ = 0;
              prVar14 = llvm::raw_ostream::operator<<((raw_ostream *)pCVar13,Str);
              __fd = (int)pcVar28;
              pcVar28 = prVar14->OutBufCur;
              if (prVar14->OutBufEnd == pcVar28) {
                __fd = 0x1ad088;
                llvm::raw_ostream::write(prVar14,0x1ad088,(void *)0x1,(size_t)pcVar28);
              }
              else {
                *pcVar28 = '\n';
                prVar14->OutBufCur = prVar14->OutBufCur + 1;
              }
              if (local_1d8.twine != (Twine *)local_1c8) {
                free(local_1d8.twine);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_228.twine != &local_218) {
                free(local_228.twine);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_270.twine != &local_260) {
                uVar17 = CONCAT71(local_260._M_allocated_capacity._1_7_,local_260._M_local_buf[0]) +
                         1;
                operator_delete(local_270.twine,uVar17);
                __fd = (int)uVar17;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_250.twine != &local_240) {
                uVar17 = local_240._M_allocated_capacity + 1;
                operator_delete(local_250.twine,uVar17);
                __fd = (int)uVar17;
              }
              pbVar15 = (this->sourcesList).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              iVar25 = iVar25 + 1;
            } while ((long)(this->sourcesList).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar15 >> 5 != uVar27
                    );
          }
          if ((ulong)((long)pvStack_2e0 - (long)pcStack_2d8) < 2) {
            __fd = 0x1a01ea;
            llvm::raw_ostream::write
                      ((raw_ostream *)&local_2f0,0x1a01ea,(void *)0x2,
                       (long)pvStack_2e0 - (long)pcStack_2d8);
          }
          else {
            pcStack_2d8[0] = '}';
            pcStack_2d8[1] = '\n';
            pcStack_2d8 = pcStack_2d8 + 2;
          }
          pOVar29 = local_1e8;
          llvm::raw_fd_ostream::close((raw_fd_ostream *)&local_2f0,__fd);
          if ((long *)local_1b8.impl != &local_1a8) {
            free(local_1b8.impl);
          }
        }
        else {
          local_1b8.impl = pvVar22;
          local_1b8.ctx = pvVar18;
          pBVar11 = llbuild::core::TaskInterface::delegate(&local_1b8);
          p_Var5 = pBVar11[1]._vptr_BuildEngineDelegate[1];
          local_270.twine = (Twine *)&local_260;
          if ((undefined1 *)uVar9 == (undefined1 *)0x0) {
            local_268 = (char *)0x0;
            local_260._M_local_buf[0] = '\0';
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_270,uVar9,(undefined1 *)(uVar27 + uVar9));
          }
          plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,0x1a0128);
          paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 == paVar19) {
            local_240._M_allocated_capacity = paVar19->_M_allocated_capacity;
            local_240._8_8_ = plVar12[3];
            local_250.twine = (Twine *)&local_240;
          }
          else {
            local_240._M_allocated_capacity = paVar19->_M_allocated_capacity;
            local_250.twine = (Twine *)*plVar12;
          }
          local_248 = (char *)plVar12[1];
          *plVar12 = (long)paVar19;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          plVar12 = (long *)std::__cxx11::string::append(&local_250.character);
          plVar26 = plVar12 + 2;
          if ((long *)*plVar12 == plVar26) {
            local_1a8 = *plVar26;
            uStack_1a0 = (undefined4)plVar12[3];
            uStack_19c = *(undefined4 *)((long)plVar12 + 0x1c);
            local_1b8.impl = &local_1a8;
          }
          else {
            local_1a8 = *plVar26;
            local_1b8.impl = (long *)*plVar12;
          }
          local_1b8.ctx = (void *)plVar12[1];
          *plVar12 = (long)plVar26;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          (**(code **)(*(long *)p_Var5 + 0x58))(p_Var5,this,local_1b8.impl);
          if ((long *)local_1b8.impl != &local_1a8) {
            operator_delete(local_1b8.impl,local_1a8 + 1);
          }
          pOVar29 = local_1e8;
          if (local_250.twine != (Twine *)&local_240) {
            operator_delete(local_250.twine,local_240._M_allocated_capacity + 1);
          }
          if (local_270.twine != (Twine *)&local_260) {
            operator_delete(local_270.twine,
                            CONCAT71(local_260._M_allocated_capacity._1_7_,local_260._M_local_buf[0]
                                    ) + 1);
          }
        }
        llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)&local_2f0);
        if ((SwiftCompilerShellCommand *)local_120._0_8_ !=
            (SwiftCompilerShellCommand *)(local_120 + 0x10)) {
          free((void *)local_120._0_8_);
        }
        if (local_1dc == 0) {
          commandLine_00.Length =
               (long)local_138.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_138.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4;
          commandLine_00.Data =
               local_138.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
               _M_impl.super__Vector_impl_data._M_start;
          uVar10 = llbuild::core::TaskInterface::spawn(&local_198,local_158,commandLine_00);
          if (uVar10 == Succeeded) {
            local_2f0.decUI = (uint)this;
            local_2f0._4_4_ = (undefined4)((ulong)this >> 0x20);
            local_2e8 = SUB84(local_198.impl,0);
            uStack_2e4 = (undefined4)((ulong)local_198.impl >> 0x20);
            pvStack_2e0 = local_198.ctx;
            local_2b8 = (pOVar29->Storage).hasVal;
            if ((bool)local_2b8 == true) {
              local_2c8 = 0;
              uStack_2c0 = 0;
              pcStack_2d8 = (char *)0x0;
              uStack_2d0 = 0;
              pcVar7 = *(code **)((pOVar29->Storage).storage.super_AlignedCharArray<8UL,_32UL>.
                                  buffer + 0x10);
              if (pcVar7 != (code *)0x0) {
                (*pcVar7)(&pcStack_2d8,pOVar29,2);
                local_2c8 = *(undefined8 *)
                             ((pOVar29->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer +
                             0x10);
                uStack_2c0 = *(undefined8 *)
                              ((pOVar29->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer +
                              0x18);
              }
            }
            local_2b0 = 0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_2a8,&local_178);
            std::function<void(llbuild::basic::QueueJobContext*)>::
            function<(anonymous_namespace)::SwiftCompilerShellCommand::executeExternalCommand(llbuild::buildsystem::BuildSystem&,llbuild::core::TaskInterface,llbuild::basic::QueueJobContext*,llvm::Optional<std::function<void(llbuild::basic::ProcessResult)>>)::_lambda(llbuild::basic::QueueJobContext*)_1_,void>
                      ((function<void(llbuild::basic::QueueJobContext*)> *)local_a8._M_pod_data,
                       (anon_class_96_5_980d2744 *)&local_2f0);
            p_Var1 = (_Any_data *)(local_120 + 8);
            local_120._8_8_ = (void *)0x0;
            local_120._16_8_ = 0;
            local_108 = (_Manager_type)0x0;
            p_Stack_100 = (_Invoker_type)0x0;
            local_120._0_8_ = this;
            if (local_98 != (_Manager_type)0x0) {
              (*local_98)(p_Var1,&local_a8,__clone_functor);
              local_108 = local_98;
              p_Stack_100 = p_Stack_90;
            }
            llbuild::core::TaskInterface::spawn(&local_198,(QueueJob *)local_120,High);
            if (local_108 != (_Manager_type)0x0) {
              (*local_108)(p_Var1,p_Var1,__destroy_functor);
            }
            if (local_98 != (_Manager_type)0x0) {
              (*local_98)(&local_a8,&local_a8,__destroy_functor);
            }
            (anonymous_namespace)::SwiftCompilerShellCommand::
            executeExternalCommand(llbuild::buildsystem::BuildSystem&,llbuild::core::TaskInterface,llbuild::basic::QueueJobContext*,llvm::Optional<std::function<void(llbuild::basic::ProcessResult)>>)
            ::{lambda(llbuild::basic::QueueJobContext*)#1}::~Optional
                      ((_lambda_llbuild__basic__QueueJobContext___1_ *)&local_2f0.character);
            goto LAB_001242b5;
          }
          if ((pOVar29->Storage).hasVal != true) goto LAB_001242b5;
        }
        else {
          if ((pOVar29->Storage).hasVal != true) goto LAB_001242b5;
          local_2f0.decUI = Failed;
          uVar10 = local_2f0.decUI;
        }
        local_2f0.decUI = uVar10;
        local_2e8 = 0xffffffff;
        local_2f0._4_4_ = 0xffffffff;
        pvStack_2e0 = (void *)0x0;
        pcStack_2d8 = (char *)0x0;
        uStack_2d0 = 0;
        if (*(long *)((pOVar29->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer + 0x10) !=
            0) {
          (**(code **)((pOVar29->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer + 0x18))
                    (pOVar29,&local_2f0);
LAB_001242b5:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_178);
          if (local_138.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
              _M_impl.super__Vector_impl_data._M_start != (StringRef *)0x0) {
            operator_delete(local_138.
                            super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_138.
                                  super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_138.
                                  super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((undefined1 *)local_f8._M_allocated_capacity == local_e8) {
            return;
          }
          free((void *)local_f8._M_allocated_capacity);
          return;
        }
        goto LAB_00124302;
      }
      plVar12 = *(long **)((long)system->impl + 8);
      pcVar28 = "\'sources\' and \'objects\' are not the same size";
    }
  }
  local_f8._8_4_ = 0;
  local_f8._M_allocated_capacity = 0;
  llvm::Twine::Twine((Twine *)&local_2f0,pcVar28);
  (**(code **)(*plVar12 + 0x18))(plVar12,"",0,&local_f8,&local_2f0);
  if ((completionFn->Storage).hasVal == true) {
    local_2f0.decUI = Failed;
    local_2f0._4_4_ = 0xffffffff;
    local_2e8 = 0xffffffff;
    pvStack_2e0 = (void *)0x0;
    pcStack_2d8 = (char *)0x0;
    uStack_2d0 = 0;
    if (*(long *)((completionFn->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer + 0x10)
        == 0) {
LAB_00124302:
      local_2e8 = 0xffffffff;
      local_2f0._4_4_ = 0xffffffff;
      uStack_2d0 = 0;
      pcStack_2d8 = (char *)0x0;
      pvStack_2e0 = (void *)0x0;
      std::__throw_bad_function_call();
    }
    (**(code **)((completionFn->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer + 0x18))
              (completionFn,&local_2f0);
  }
  return;
}

Assistant:

virtual void executeExternalCommand(
      BuildSystem& system,
      TaskInterface ti,
      QueueJobContext* context,
      llvm::Optional<ProcessCompletionFn> completionFn) override {
    // FIXME: Need to add support for required parameters.
    if (sourcesList.empty()) {
      system.getDelegate().error("", {}, "no configured 'sources'");
      if (completionFn.hasValue())
        completionFn.getValue()(ProcessStatus::Failed);
      return;
    }
    if (objectsList.empty()) {
      system.getDelegate().error("", {}, "no configured 'objects'");
      if (completionFn.hasValue())
        completionFn.getValue()(ProcessStatus::Failed);
      return;
    }
    if (moduleName.empty()) {
      system.getDelegate().error("", {}, "no configured 'module-name'");
      if (completionFn.hasValue())
        completionFn.getValue()(ProcessStatus::Failed);
      return;
    }
    if (tempsPath.empty()) {
      system.getDelegate().error("", {}, "no configured 'temps-path'");
      if (completionFn.hasValue())
        completionFn.getValue()(ProcessStatus::Failed);
      return;
    }

    if (sourcesList.size() != objectsList.size()) {
      system.getDelegate().error(
          "", {}, "'sources' and 'objects' are not the same size");
      if (completionFn.hasValue())
        completionFn.getValue()(ProcessStatus::Failed);
      return;
    }

    // Ensure the temporary directory exists.
    //
    // We ignore failures here, and just let things that depend on this fail.
    //
    // FIXME: This should really be done using an additional implicit input, so
    // it only happens once per build.
    (void) system.getFileSystem().createDirectories(tempsPath);
 
    SmallString<64> outputFileMapPath;
    getOutputFileMapPath(outputFileMapPath);
    
    // Form the complete command.
    std::vector<StringRef> commandLine;
    constructCommandLineArgs(outputFileMapPath, commandLine);

    // Write the output file map.
    std::vector<std::string> depsFiles;
    if (!writeOutputFileMap(ti, outputFileMapPath, depsFiles)) {
      if (completionFn.hasValue())
        completionFn.getValue()(ProcessStatus::Failed);
      return;
    }

    // Execute the command.
    auto result = ti.spawn(context, commandLine);

    if (result != ProcessStatus::Succeeded) {
      // If the command failed, there is no need to gather dependencies.
      if (completionFn.hasValue())
        completionFn.getValue()(result);
      return;
    }

    // Load all of the discovered dependencies.
    ti.spawn({ this, [this, ti, completionFn, result, depsFiles](QueueJobContext* context) mutable {
      for (const auto& depsPath: depsFiles) {
        if (!processDiscoveredDependencies(ti, depsPath)) {
          if (completionFn.hasValue())
            completionFn.getValue()(ProcessStatus::Failed);
          return;
        }
      }
      if (completionFn.hasValue())
        completionFn.getValue()(result);
    }}, basic::QueueJobPriority::High);
  }